

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVCVTD(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar4;
  
  uVar4 = Insn >> 5 & 1;
  DVar1 = MCDisassembler_Fail;
  if ((Insn & 0x380f00) == 0xf00) {
    if (uVar4 == 0) {
      MCInst_setOpcode(Inst,0x55d);
      DVar1 = DecodeNEONModImmInstruction(Inst,Insn,Address_00,Decoder);
      return DVar1;
    }
  }
  else if (((Insn >> 0x15 & 1) != 0) &&
          (DVar2 = DecodeDPRRegisterClass
                             (Inst,Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf,Address,Decoder),
          DVar1 = MCDisassembler_Fail, (DVar2 | 2) == MCDisassembler_Success)) {
    DVar3 = DecodeDPRRegisterClass(Inst,uVar4 << 4 | Insn & 0xf,Address_01,Decoder);
    DVar1 = DVar2;
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar1 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)(0x40 - (Insn >> 0x10 & 0x3f)));
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeVCVTD(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Vm, imm, cmode, op;
	unsigned Vd = (fieldFromInstruction_4(Insn, 12, 4) << 0);
	Vd |= (fieldFromInstruction_4(Insn, 22, 1) << 4);
	Vm = (fieldFromInstruction_4(Insn, 0, 4) << 0);
	Vm |= (fieldFromInstruction_4(Insn, 5, 1) << 4);
	imm = fieldFromInstruction_4(Insn, 16, 6);
	cmode = fieldFromInstruction_4(Insn, 8, 4);
	op = fieldFromInstruction_4(Insn, 5, 1);

	// VMOVv2f32 is ambiguous with these decodings.
	if (!(imm & 0x38) && cmode == 0xF) {
		if (op == 1) return MCDisassembler_Fail;
		MCInst_setOpcode(Inst, ARM_VMOVv2f32);
		return DecodeNEONModImmInstruction(Inst, Insn, Address, Decoder);
	}

	if (!(imm & 0x20)) return MCDisassembler_Fail;

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Vm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 64 - imm);

	return S;
}